

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O2

void __kmp_dispatch_init_algorithm<int>
               (ident_t *loc,int gtid,dispatch_private_info_template<int> *pr,sched_type schedule,
               int lb,int ub,signed_t st,kmp_uint64 *cur_chunk,signed_t chunk,int nproc,int tid)

{
  double base;
  kmp_info_t *pkVar1;
  kmp_team_p *pkVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  unsigned_t uVar8;
  sched_type sVar9;
  sched_type sVar10;
  UT UVar11;
  sched_type *psVar12;
  int nth;
  sched_type sVar13;
  int iVar14;
  uint y;
  ulong uVar15;
  undefined8 uVar16;
  uint uVar17;
  UT UVar18;
  sched_type sVar19;
  uint idx;
  bool bVar20;
  bool bVar21;
  longdouble in_ST0;
  longdouble lVar22;
  longdouble x;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar23;
  longdouble in_ST4;
  longdouble lVar24;
  longdouble lVar25;
  longdouble lVar26;
  kmp_msg_t local_78;
  kmp_msg_t local_60;
  kmp_msg_t local_48;
  
  pkVar1 = __kmp_threads[gtid];
  pkVar2 = (pkVar1->th).th_team;
  iVar7 = (pkVar2->t).t_serialized;
  bVar21 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (__kmp_forkjoin_frames_mode == 3)) {
    if ((*(int *)(pkVar1->th_pad + 0x20) == 0) &&
       ((pkVar1->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar21 = (pkVar2->t).t_active_level == 1;
    }
    else {
      bVar21 = false;
    }
  }
  sVar13 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  bVar20 = sVar13 - kmp_nm_lower < 0x28;
  uVar17 = ((uint)pr->flags & 0xfffffffd) + (uint)bVar20 * 2;
  sVar9 = sVar13 - 0x80;
  if (!bVar20) {
    sVar9 = sVar13;
  }
  pr->type_size = 4;
  if ((sVar9 & kmp_ord_lower) == 0) {
    uVar15 = (ulong)((schedule >> 0x1e & 1) == 0);
    pr->flags = (kmp_sched_flags_t)(uVar17 & 0xfffffffe);
  }
  else {
    uVar15 = 1;
    pr->flags = (kmp_sched_flags_t)(uVar17 | 1);
    sVar9 = sVar9 - kmp_sch_lower;
  }
  sVar13 = (sched_type)uVar15;
  if (sVar9 == kmp_sch_runtime) {
    sVar9 = (pkVar2->t).t_sched.field_0.r_sched_type;
    sVar10 = sVar9 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
    if (sVar10 == kmp_sch_default) {
      psVar12 = &__kmp_static;
LAB_00153407:
      sVar10 = *psVar12;
    }
    else if (sVar10 == kmp_sch_guided_chunked) {
      psVar12 = &__kmp_guided;
      goto LAB_00153407;
    }
    sVar13 = (sched_type)((sVar9 >> 0x1e & 1) == 0);
    chunk = (pkVar2->t).t_sched.field_0.chunk;
    if (cur_chunk != (kmp_uint64 *)0x0) {
      *cur_chunk = (long)chunk;
    }
LAB_0015341e:
    if (sVar10 == kmp_sch_auto) {
      sVar10 = __kmp_auto;
    }
    sVar13 = sVar13 | sVar10 ^ kmp_sch_dynamic_chunked;
    uVar15 = (ulong)sVar13;
    sVar19 = kmp_sch_static_steal;
    if (sVar13 != 0) {
      sVar19 = sVar10;
    }
    if ((nproc < 0x100001) || (sVar19 != kmp_sch_guided_analytical_chunked)) {
      if (sVar19 == kmp_sch_runtime_simd) {
        sVar9 = (pkVar2->t).t_sched.field_0.r_sched_type;
        sVar19 = kmp_sch_static_balanced_chunked;
        if (((sVar9 & 0x9ffffffb) != kmp_sch_default) &&
           (sVar9 = sVar9 & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic),
           sVar9 != __kmp_static)) {
          sVar19 = sVar9;
          if (sVar9 == __kmp_guided) {
            sVar19 = kmp_sch_guided_simd;
          }
          if (sVar9 == kmp_sch_guided_chunked) {
            sVar19 = kmp_sch_guided_simd;
          }
          chunk = chunk * (pkVar2->t).t_sched.field_0.chunk;
        }
        if (cur_chunk != (kmp_uint64 *)0x0) {
          *cur_chunk = (long)chunk;
        }
      }
    }
    else {
      uVar15 = 0x40059;
      __kmp_msg_format(&local_48,0x40059);
      __kmp_msg(kmp_ms_warning);
      sVar19 = kmp_sch_guided_iterative_chunked;
    }
    (pr->u).p.field_6.parm1 = chunk;
  }
  else {
    sVar10 = __kmp_guided;
    if ((sVar9 == kmp_sch_guided_chunked) ||
       (sVar19 = __kmp_static, sVar10 = sVar9, sVar9 != kmp_sch_default)) {
      if (chunk < 2) {
        chunk = 1;
      }
      goto LAB_0015341e;
    }
  }
  if (0xe < sVar19 - kmp_sch_static_chunked) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_dispatch.cpp"
                       ,0x11d);
  }
  (pr->u).p.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    __kmp_error_construct
              (kmp_i18n_msg_CnsLoopIncrZeroProhibited,(uint)pr->flags & ct_parallel | ct_pdo,loc);
LAB_0015359c:
    uVar16 = 0;
    uVar17 = 0;
    if (lb <= ub) {
      uVar17 = (uint)(ub - lb) / (uint)st;
LAB_001535b2:
      uVar16 = 0;
      uVar17 = uVar17 + 1;
    }
  }
  else {
    if (st != 1) {
      if (-1 < st) goto LAB_0015359c;
      uVar16 = 0;
      uVar17 = 0;
      if (lb < ub) goto LAB_001535b8;
      uVar17 = (uint)(lb - ub) / (uint)-st;
      goto LAB_001535b2;
    }
    uVar17 = 0;
    uVar16 = CONCAT71((int7)(uVar15 >> 8),1);
    if (lb <= ub) {
      uVar17 = (ub - lb) + 1;
    }
  }
LAB_001535b8:
  (pr->u).p.lb = lb;
  (pr->u).p.ub = ub;
  (pr->u).p.st = st;
  (pr->u).p.tc = uVar17;
  if ((iVar7 == 0) && (((uint)pr->flags & 1) != 0)) {
    pr->ordered_bumped = 0;
    (pr->u).p64.field_6.parm1 = 1;
  }
  switch(sVar19 - kmp_sch_static_chunked) {
  case 0:
  case 2:
    if ((pr->u).p.field_6.parm1 < 1) {
      (pr->u).p.field_6.parm1 = 1;
    }
    goto LAB_0015388a;
  default:
    __kmp_msg_format(&local_60,0x40058);
    __kmp_msg_format(&local_78,0x50016);
    __kmp_fatal();
  case 6:
    iVar7 = (int)uVar17 / (nproc * 2);
    if (iVar7 < 2) {
      iVar7 = 1;
    }
    iVar14 = iVar7;
    if (chunk < iVar7) {
      iVar14 = chunk;
    }
    if (chunk < 1) {
      iVar14 = 1;
    }
    iVar4 = (int)(iVar14 + iVar7 + uVar17 * 2 + -1) / (iVar14 + iVar7);
    iVar3 = 2;
    if (2 < iVar4) {
      iVar3 = iVar4;
    }
    (pr->u).p.field_6.parm1 = iVar14;
    (pr->u).p.field_6.parm2 = iVar7;
    (pr->u).p.field_6.parm3 = iVar3;
    (pr->u).p.field_6.parm4 = (iVar7 - iVar14) / (iVar3 + -1);
    sVar19 = kmp_sch_trapezoidal;
    goto LAB_0015388a;
  case 7:
    if (1 < nproc) {
      uVar17 = (int)(uVar17 + nproc + -1) / nproc;
    }
    break;
  case 8:
    goto switchD_00153605_caseD_8;
  case 9:
  case 0xd:
    if (1 < nproc) {
      if ((long)((ulong)(uint)nproc * ((long)chunk * 2 + 1)) < (long)(int)uVar17) {
        (pr->u).p.field_6.parm2 = (chunk + 1) * nproc * 2;
        *(double *)((long)&pr->u + 0x28) = 0.5 / (double)nproc;
        goto LAB_0015388a;
      }
LAB_001538c9:
      sVar19 = kmp_sch_dynamic_chunked;
      goto LAB_0015388a;
    }
    break;
  case 10:
    if (1 < nproc) {
      if ((long)((ulong)(uint)nproc * ((long)chunk * 2 + 1)) < (long)(int)uVar17) {
        lVar22 = (((longdouble)chunk + (longdouble)chunk + (longdouble)1) * (longdouble)nproc) /
                 (longdouble)(int)uVar17;
        base = (double)((longdouble)-0.5 / (longdouble)nproc + (longdouble)1);
        *(double *)((long)&pr->u + 0x28) = base;
        x = (longdouble)base;
        lVar24 = in_ST4;
        lVar26 = in_ST4;
        __kmp_pow<unsigned_int>((longdouble *)0xe5,x,(uint)uVar16);
        uVar6 = 0;
        uVar5 = 0xe5;
        if (lVar22 < in_ST0) {
          uVar5 = 0xe5;
          do {
            uVar6 = uVar5;
            in_ST0 = in_ST0 * in_ST0;
            uVar5 = uVar6 * 2;
            if (in_ST0 <= lVar22) break;
          } while (uVar6 < 0x4000000);
        }
        while (idx = uVar5, lVar25 = lVar26, lVar23 = in_ST4, y = (uint)uVar16, uVar6 + 1 < idx) {
          uVar5 = idx + uVar6 >> 1;
          lVar26 = lVar25;
          __kmp_pow<unsigned_int>((longdouble *)(ulong)uVar5,x,y);
          bVar21 = lVar22 < in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = lVar23;
          in_ST4 = lVar24;
          lVar24 = lVar25;
          if (bVar21) {
            uVar6 = uVar5;
            uVar5 = idx;
          }
        }
        if (((idx == 0) ||
            (__kmp_pow<unsigned_int>((longdouble *)(ulong)(idx - 1),x,y), in_ST1 <= lVar22)) ||
           (__kmp_pow<unsigned_int>((longdouble *)(ulong)idx,x,y), lVar22 < in_ST2)) {
          __kmp_debug_assert("assertion failure",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/flang-compiler[P]openmp/runtime/src/kmp_dispatch.cpp"
                             ,0x25c);
        }
        (pr->u).p.field_6.parm2 = idx;
        uVar8 = __kmp_dispatch_guided_remaining<int>(uVar17,base,idx);
        (pr->u).p.count = uVar17 - (chunk * idx + uVar8);
        sVar19 = kmp_sch_guided_analytical_chunked;
        goto LAB_0015388a;
      }
      goto LAB_001538c9;
    }
    break;
  case 0xb:
    uVar5 = ((int)uVar17 / chunk + 1) - (uint)((int)uVar17 % chunk == 0);
    if ((1 < nproc) && (nproc <= (int)uVar5)) {
      uVar6 = uVar5 / (uint)nproc;
      uVar5 = uVar5 % (uint)nproc;
      sVar19 = kmp_sch_static_steal;
      uVar17 = tid;
      if ((int)uVar5 < tid) {
        uVar17 = uVar5;
      }
      UVar18 = uVar17 + uVar6 * tid;
      (pr->u).p.count = UVar18;
      (pr->u).p.ub = (tid < (int)uVar5) + uVar6 + UVar18;
      (pr->u).p.field_6.parm2 = lb;
      uVar17 = uVar5 + uVar6;
      if ((uint)nproc <= uVar5 + uVar6) {
        uVar17 = nproc;
      }
      (pr->u).p.field_6.parm3 = uVar17;
      (pr->u).p.field_6.parm4 = (tid + 1) % nproc;
      (pr->u).p.st = st;
      goto LAB_0015388a;
    }
switchD_00153605_caseD_8:
    if (nproc < 2) {
      if ((int)uVar17 < 1) {
LAB_001538fb:
        (pr->u).p.count = 1;
        (pr->u).p.field_6.parm1 = 0;
        sVar19 = kmp_sch_static_balanced;
        goto LAB_0015388a;
      }
      UVar18 = uVar17 - 1;
      (pr->u).p.field_6.parm1 = 1;
      UVar11 = 0;
    }
    else if ((int)uVar17 < nproc) {
      if ((int)uVar17 <= tid) goto LAB_001538fb;
      *(uint *)((long)&pr->u + 0x20) = (uint)(uVar17 - 1 == tid);
      UVar18 = tid;
      UVar11 = tid;
    }
    else {
      uVar6 = uVar17 % (uint)nproc;
      uVar5 = uVar6;
      if (tid <= (int)uVar6) {
        uVar5 = tid;
      }
      UVar11 = uVar5 + (uVar17 / (uint)nproc) * tid;
      UVar18 = (uVar17 / (uint)nproc + UVar11) - (uint)((int)uVar6 <= tid);
      *(uint *)((long)&pr->u + 0x20) = (uint)(nproc + -1 == tid);
    }
    if (bVar21 && cur_chunk != (kmp_uint64 *)0x0) {
      *cur_chunk = (long)(int)((UVar18 - UVar11) + 1);
    }
    if ((char)uVar16 == '\0') {
      iVar7 = UVar18 * st + lb;
      (pr->u).p.lb = UVar11 * st + lb;
      if (st < 1) {
        if (iVar7 + st < ub) {
          iVar7 = ub;
        }
      }
      else if (ub < iVar7 + st) {
        iVar7 = ub;
      }
    }
    else {
      (pr->u).p.lb = UVar11 + lb;
      iVar7 = lb + UVar18;
    }
    (pr->u).p.ub = iVar7;
    sVar19 = kmp_sch_static_balanced;
    if (((uint)pr->flags & 1) != 0) {
      (pr->u).p.ordered_lower = UVar11;
      (pr->u).p.ordered_upper = UVar18;
    }
    goto LAB_0015388a;
  case 0xc:
    if (nproc < 2) break;
    (pr->u).p.field_6.parm1 = -chunk & ((int)(uVar17 + nproc + -1) / nproc + chunk) - 1U;
    goto LAB_00153886;
  }
  (pr->u).p.field_6.parm1 = uVar17;
LAB_00153886:
  sVar19 = kmp_sch_static_greedy;
LAB_0015388a:
  pr->schedule = sVar19;
  return;
}

Assistant:

void __kmp_dispatch_init_algorithm(ident_t *loc, int gtid,
                                   dispatch_private_info_template<T> *pr,
                                   enum sched_type schedule, T lb, T ub,
                                   typename traits_t<T>::signed_t st,
#if USE_ITT_BUILD
                                   kmp_uint64 *cur_chunk,
#endif
                                   typename traits_t<T>::signed_t chunk,
                                   T nproc, T tid) {
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::floating_t DBL;

  int active;
  T tc;
  kmp_info_t *th;
  kmp_team_t *team;
  int monotonicity;
  bool use_hier;

#ifdef KMP_DEBUG
  typedef typename traits_t<T>::signed_t ST;
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d called "
                            "pr:%%p lb:%%%s ub:%%%s st:%%%s "
                            "schedule:%%d chunk:%%%s nproc:%%%s tid:%%%s\n",
                            traits_t<T>::spec, traits_t<T>::spec,
                            traits_t<ST>::spec, traits_t<ST>::spec,
                            traits_t<T>::spec, traits_t<T>::spec);
    KD_TRACE(10, (buff, gtid, pr, lb, ub, st, schedule, chunk, nproc, tid));
    __kmp_str_free(&buff);
  }
#endif
  /* setup data */
  th = __kmp_threads[gtid];
  team = th->th.th_team;
  active = !team->t.t_serialized;

#if USE_ITT_BUILD
  int itt_need_metadata_reporting = __itt_metadata_add_ptr &&
                                    __kmp_forkjoin_frames_mode == 3 &&
                                    KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
                                    th->th.th_teams_microtask == NULL &&
#endif
                                    team->t.t_active_level == 1;
#endif

#if KMP_USE_HIER_SCHED
  use_hier = pr->flags.use_hier;
#else
  use_hier = false;
#endif

  /* Pick up the nonmonotonic/monotonic bits from the scheduling type */
  monotonicity = __kmp_get_monotonicity(schedule, use_hier);
  schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

  /* Pick up the nomerge/ordered bits from the scheduling type */
  if ((schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper)) {
    pr->flags.nomerge = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
  } else {
    pr->flags.nomerge = FALSE;
  }
  pr->type_size = traits_t<T>::type_size; // remember the size of variables
  if (kmp_ord_lower & schedule) {
    pr->flags.ordered = TRUE;
    schedule =
        (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
  } else {
    pr->flags.ordered = FALSE;
  }
  // Ordered overrides nonmonotonic
  if (pr->flags.ordered) {
    monotonicity = SCHEDULE_MONOTONIC;
  }

  if (schedule == kmp_sch_static) {
    schedule = __kmp_static;
  } else {
    if (schedule == kmp_sch_runtime) {
      // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if
      // not specified)
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      } else if (schedule == kmp_sch_static) {
        schedule = __kmp_static;
      }
      // Use the chunk size specified by OMP_SCHEDULE (or default if not
      // specified)
      chunk = team->t.t_sched.chunk;
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format("__kmp_dispatch_init_algorithm: T#%%d new: "
                                "schedule:%%d chunk:%%%s\n",
                                traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    } else {
      if (schedule == kmp_sch_guided_chunked) {
        schedule = __kmp_guided;
      }
      if (chunk <= 0) {
        chunk = KMP_DEFAULT_CHUNK;
      }
    }

    if (schedule == kmp_sch_auto) {
      // mapping and differentiation: in the __kmp_do_serial_initialize()
      schedule = __kmp_auto;
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: kmp_sch_auto: T#%%d new: "
            "schedule:%%d chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
#if KMP_STATIC_STEAL_ENABLED
    // map nonmonotonic:dynamic to static steal
    if (schedule == kmp_sch_dynamic_chunked) {
      if (monotonicity == SCHEDULE_NONMONOTONIC)
        schedule = kmp_sch_static_steal;
    }
#endif
    /* guided analytical not safe for too many threads */
    if (schedule == kmp_sch_guided_analytical_chunked && nproc > 1 << 20) {
      schedule = kmp_sch_guided_iterative_chunked;
      KMP_WARNING(DispatchManyThreads);
    }
#if OMP_45_ENABLED
    if (schedule == kmp_sch_runtime_simd) {
      // compiler provides simd_width in the chunk parameter
      schedule = team->t.t_sched.r_sched_type;
      monotonicity = __kmp_get_monotonicity(schedule, use_hier);
      schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);
      // Detail the schedule if needed (global controls are differentiated
      // appropriately)
      if (schedule == kmp_sch_static || schedule == kmp_sch_auto ||
          schedule == __kmp_static) {
        schedule = kmp_sch_static_balanced_chunked;
      } else {
        if (schedule == kmp_sch_guided_chunked || schedule == __kmp_guided) {
          schedule = kmp_sch_guided_simd;
        }
        chunk = team->t.t_sched.chunk * chunk;
      }
#if USE_ITT_BUILD
      if (cur_chunk)
        *cur_chunk = chunk;
#endif
#ifdef KMP_DEBUG
      {
        char *buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init_algorithm: T#%%d new: schedule:%%d"
            " chunk:%%%s\n",
            traits_t<ST>::spec);
        KD_TRACE(10, (buff, gtid, schedule, chunk));
        __kmp_str_free(&buff);
      }
#endif
    }
#endif // OMP_45_ENABLED
    pr->u.p.parm1 = chunk;
  }
  KMP_ASSERT2((kmp_sch_lower < schedule && schedule < kmp_sch_upper),
              "unknown scheduling type");

  pr->u.p.count = 0;

  if (__kmp_env_consistency_check) {
    if (st == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                            (pr->flags.ordered ? ct_pdo_ordered : ct_pdo), loc);
    }
  }
  // compute trip count
  if (st == 1) { // most common case
    if (ub >= lb) {
      tc = ub - lb + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  } else if (st < 0) {
    if (lb >= ub) {
      // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(lb - ub) / (-st) + 1;
    } else { // lb < ub
      tc = 0; // zero-trip
    }
  } else { // st > 0
    if (ub >= lb) {
      // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
      // where the division needs to be unsigned regardless of the result type
      tc = (UT)(ub - lb) / st + 1;
    } else { // ub < lb
      tc = 0; // zero-trip
    }
  }

#if KMP_STATS_ENABLED
  if (KMP_MASTER_GTID(gtid)) {
    KMP_COUNT_VALUE(OMP_loop_dynamic_total_iterations, tc);
  }
#endif

  pr->u.p.lb = lb;
  pr->u.p.ub = ub;
  pr->u.p.st = st;
  pr->u.p.tc = tc;

#if KMP_OS_WINDOWS
  pr->u.p.last_upper = ub + st;
#endif /* KMP_OS_WINDOWS */

  /* NOTE: only the active parallel region(s) has active ordered sections */

  if (active) {
    if (pr->flags.ordered) {
      pr->ordered_bumped = 0;
      pr->u.p.ordered_lower = 1;
      pr->u.p.ordered_upper = 0;
    }
  }

  switch (schedule) {
#if (KMP_STATIC_STEAL_ENABLED)
  case kmp_sch_static_steal: {
    T ntc, init;

    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_steal case\n",
              gtid));

    ntc = (tc % chunk ? 1 : 0) + tc / chunk;
    if (nproc > 1 && ntc >= nproc) {
      KMP_COUNT_BLOCK(OMP_LOOP_STATIC_STEAL);
      T id = tid;
      T small_chunk, extras;

      small_chunk = ntc / nproc;
      extras = ntc % nproc;

      init = id * small_chunk + (id < extras ? id : extras);
      pr->u.p.count = init;
      pr->u.p.ub = init + small_chunk + (id < extras ? 1 : 0);

      pr->u.p.parm2 = lb;
      // parm3 is the number of times to attempt stealing which is
      // proportional to the number of chunks per thread up until
      // the maximum value of nproc.
      pr->u.p.parm3 = KMP_MIN(small_chunk + extras, nproc);
      pr->u.p.parm4 = (id + 1) % nproc; // remember neighbour tid
      pr->u.p.st = st;
      if (traits_t<T>::type_size > 4) {
        // AC: TODO: check if 16-byte CAS available and use it to
        // improve performance (probably wait for explicit request
        // before spending time on this).
        // For now use dynamically allocated per-thread lock,
        // free memory in __kmp_dispatch_next when status==0.
        KMP_DEBUG_ASSERT(th->th.th_dispatch->th_steal_lock == NULL);
        th->th.th_dispatch->th_steal_lock =
            (kmp_lock_t *)__kmp_allocate(sizeof(kmp_lock_t));
        __kmp_init_lock(th->th.th_dispatch->th_steal_lock);
      }
      break;
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_balanced\n",
                     gtid));
      schedule = kmp_sch_static_balanced;
      /* too few iterations: fall-through to kmp_sch_static_balanced */
    } // if
    /* FALL-THROUGH to static balanced */
    KMP_FALLTHROUGH();
  } // case
#endif
  case kmp_sch_static_balanced: {
    T init, limit;

    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_balanced case\n",
         gtid));

    if (nproc > 1) {
      T id = tid;

      if (tc < nproc) {
        if (id < tc) {
          init = id;
          limit = id;
          pr->u.p.parm1 = (id == tc - 1); /* parm1 stores *plastiter */
        } else {
          pr->u.p.count = 1; /* means no more chunks to execute */
          pr->u.p.parm1 = FALSE;
          break;
        }
      } else {
        T small_chunk = tc / nproc;
        T extras = tc % nproc;
        init = id * small_chunk + (id < extras ? id : extras);
        limit = init + small_chunk - (id < extras ? 0 : 1);
        pr->u.p.parm1 = (id == nproc - 1);
      }
    } else {
      if (tc > 0) {
        init = 0;
        limit = tc - 1;
        pr->u.p.parm1 = TRUE;
      } else {
        // zero trip count
        pr->u.p.count = 1; /* means no more chunks to execute */
        pr->u.p.parm1 = FALSE;
        break;
      }
    }
#if USE_ITT_BUILD
    // Calculate chunk for metadata report
    if (itt_need_metadata_reporting)
      if (cur_chunk)
        *cur_chunk = limit - init + 1;
#endif
    if (st == 1) {
      pr->u.p.lb = lb + init;
      pr->u.p.ub = lb + limit;
    } else {
      // calculated upper bound, "ub" is user-defined upper bound
      T ub_tmp = lb + limit * st;
      pr->u.p.lb = lb + init * st;
      // adjust upper bound to "ub" if needed, so that MS lastprivate will match
      // it exactly
      if (st > 0) {
        pr->u.p.ub = (ub_tmp + st > ub ? ub : ub_tmp);
      } else {
        pr->u.p.ub = (ub_tmp + st < ub ? ub : ub_tmp);
      }
    }
    if (pr->flags.ordered) {
      pr->u.p.ordered_lower = init;
      pr->u.p.ordered_upper = limit;
    }
    break;
  } // case
#if OMP_45_ENABLED
  case kmp_sch_static_balanced_chunked: {
    // similar to balanced, but chunk adjusted to multiple of simd width
    T nth = nproc;
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d runtime(simd:static)"
                   " -> falling-through to static_greedy\n",
                   gtid));
    schedule = kmp_sch_static_greedy;
    if (nth > 1)
      pr->u.p.parm1 = ((tc + nth - 1) / nth + chunk - 1) & ~(chunk - 1);
    else
      pr->u.p.parm1 = tc;
    break;
  } // case
  case kmp_sch_guided_simd:
#endif // OMP_45_ENABLED
  case kmp_sch_guided_iterative_chunked: {
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_guided_iterative_chunked"
         " case\n",
         gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        // when remaining iters become less than parm2 - switch to dynamic
        pr->u.p.parm2 = guided_int_param * nproc * (chunk + 1);
        *(double *)&pr->u.p.parm3 =
            guided_flt_param / nproc; // may occupy parm3 and parm4
      }
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      KD_TRACE(
          100,
          ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
           gtid));
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_guided_analytical_chunked: {
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_guided_analytical_chunked case\n",
                   gtid));

    if (nproc > 1) {
      if ((2L * chunk + 1) * nproc >= tc) {
        /* chunk size too large, switch to dynamic */
        schedule = kmp_sch_dynamic_chunked;
      } else {
        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        DBL x;

#if KMP_USE_X87CONTROL
        /* Linux* OS already has 64-bit computation by default for long double,
           and on Windows* OS on Intel(R) 64, /Qlong_double doesn't work. On
           Windows* OS on IA-32 architecture, we need to set precision to 64-bit
           instead of the default 53-bit. Even though long double doesn't work
           on Windows* OS on Intel(R) 64, the resulting lack of precision is not
           expected to impact the correctness of the algorithm, but this has not
           been mathematically proven. */
        // save original FPCW and set precision to 64-bit, as
        // Windows* OS on IA-32 architecture defaults to 53-bit
        unsigned int oldFpcw = _control87(0, 0);
        _control87(_PC_64, _MCW_PC); // 0,0x30000
#endif
        /* value used for comparison in solver for cross-over point */
        long double target = ((long double)chunk * 2 + 1) * nproc / tc;

        /* crossover point--chunk indexes equal to or greater than
           this point switch to dynamic-style scheduling */
        UT cross;

        /* commonly used term: (2 nproc - 1)/(2 nproc) */
        x = (long double)1.0 - (long double)0.5 / nproc;

#ifdef KMP_DEBUG
        { // test natural alignment
          struct _test_a {
            char a;
            union {
              char b;
              DBL d;
            };
          } t;
          ptrdiff_t natural_alignment =
              (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
          //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long
          // long)natural_alignment );
          KMP_DEBUG_ASSERT(
              (((ptrdiff_t)&pr->u.p.parm3) & (natural_alignment)) == 0);
        }
#endif // KMP_DEBUG

        /* save the term in thread private dispatch structure */
        *(DBL *)&pr->u.p.parm3 = x;

        /* solve for the crossover point to the nearest integer i for which C_i
           <= chunk */
        {
          UT left, right, mid;
          long double p;

          /* estimate initial upper and lower bound */

          /* doesn't matter what value right is as long as it is positive, but
             it affects performance of the solver */
          right = 229;
          p = __kmp_pow<UT>(x, right);
          if (p > target) {
            do {
              p *= p;
              right <<= 1;
            } while (p > target && right < (1 << 27));
            /* lower bound is previous (failed) estimate of upper bound */
            left = right >> 1;
          } else {
            left = 0;
          }

          /* bisection root-finding method */
          while (left + 1 < right) {
            mid = (left + right) / 2;
            if (__kmp_pow<UT>(x, mid) > target) {
              left = mid;
            } else {
              right = mid;
            }
          } // while
          cross = right;
        }
        /* assert sanity of computed crossover point */
        KMP_ASSERT(cross && __kmp_pow<UT>(x, cross - 1) > target &&
                   __kmp_pow<UT>(x, cross) <= target);

        /* save the crossover point in thread private dispatch structure */
        pr->u.p.parm2 = cross;

// C75803
#if ((KMP_OS_LINUX || KMP_OS_WINDOWS) && KMP_ARCH_X86) && (!defined(KMP_I8))
#define GUIDED_ANALYTICAL_WORKAROUND (*(DBL *)&pr->u.p.parm3)
#else
#define GUIDED_ANALYTICAL_WORKAROUND (x)
#endif
        /* dynamic-style scheduling offset */
        pr->u.p.count = tc - __kmp_dispatch_guided_remaining(
                                 tc, GUIDED_ANALYTICAL_WORKAROUND, cross) -
                        cross * chunk;
#if KMP_USE_X87CONTROL
        // restore FPCW
        _control87(oldFpcw, _MCW_PC);
#endif
      } // if
    } else {
      KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d falling-through to "
                     "kmp_sch_static_greedy\n",
                     gtid));
      schedule = kmp_sch_static_greedy;
      /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
      pr->u.p.parm1 = tc;
    } // if
  } // case
  break;
  case kmp_sch_static_greedy:
    KD_TRACE(
        100,
        ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_static_greedy case\n",
         gtid));
    pr->u.p.parm1 = (nproc > 1) ? (tc + nproc - 1) / nproc : tc;
    break;
  case kmp_sch_static_chunked:
  case kmp_sch_dynamic_chunked:
    if (pr->u.p.parm1 <= 0) {
      pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
    }
    KD_TRACE(100, ("__kmp_dispatch_init_algorithm: T#%d "
                   "kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n",
                   gtid));
    break;
  case kmp_sch_trapezoidal: {
    /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

    T parm1, parm2, parm3, parm4;
    KD_TRACE(100,
             ("__kmp_dispatch_init_algorithm: T#%d kmp_sch_trapezoidal case\n",
              gtid));

    parm1 = chunk;

    /* F : size of the first cycle */
    parm2 = (tc / (2 * nproc));

    if (parm2 < 1) {
      parm2 = 1;
    }

    /* L : size of the last cycle.  Make sure the last cycle is not larger
       than the first cycle. */
    if (parm1 < 1) {
      parm1 = 1;
    } else if (parm1 > parm2) {
      parm1 = parm2;
    }

    /* N : number of cycles */
    parm3 = (parm2 + parm1);
    parm3 = (2 * tc + parm3 - 1) / parm3;

    if (parm3 < 2) {
      parm3 = 2;
    }

    /* sigma : decreasing incr of the trapezoid */
    parm4 = (parm3 - 1);
    parm4 = (parm2 - parm1) / parm4;

    // pointless check, because parm4 >= 0 always
    // if ( parm4 < 0 ) {
    //    parm4 = 0;
    //}

    pr->u.p.parm1 = parm1;
    pr->u.p.parm2 = parm2;
    pr->u.p.parm3 = parm3;
    pr->u.p.parm4 = parm4;
  } // case
  break;

  default: {
    __kmp_fatal(KMP_MSG(UnknownSchedTypeDetected), // Primary message
                KMP_HNT(GetNewerLibrary), // Hint
                __kmp_msg_null // Variadic argument list terminator
                );
  } break;
  } // switch
  pr->schedule = schedule;
}